

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractDOMParser.cpp
# Opt level: O0

DOMAttr * __thiscall
xercesc_4_0::AbstractDOMParser::createAttrNS
          (AbstractDOMParser *this,XMLCh *namespaceURI,XMLCh *elemPrefix,XMLCh *localName,
          XMLCh *qName)

{
  DOMAttrNSImpl *this_00;
  DOMDocument *local_48;
  XMLCh *qName_local;
  XMLCh *localName_local;
  XMLCh *elemPrefix_local;
  XMLCh *namespaceURI_local;
  AbstractDOMParser *this_local;
  
  this_00 = (DOMAttrNSImpl *)operator_new(0x88,this->fDocument,ATTR_NS_OBJECT);
  local_48 = (DOMDocument *)0x0;
  if (this->fDocument != (DOMDocumentImpl *)0x0) {
    local_48 = &this->fDocument->super_DOMDocument;
  }
  DOMAttrNSImpl::DOMAttrNSImpl(this_00,local_48,namespaceURI,elemPrefix,localName,qName);
  return (DOMAttr *)this_00;
}

Assistant:

DOMAttr* AbstractDOMParser::
createAttrNS (const XMLCh* namespaceURI,
              const XMLCh* elemPrefix,
              const XMLCh* localName,
              const XMLCh* qName)
{
  return new (fDocument, DOMMemoryManager::ATTR_NS_OBJECT)
    DOMAttrNSImpl (fDocument,
                   namespaceURI,
                   elemPrefix,
                   localName,
                   qName);
}